

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseExpressionG(FScanner *sc,PClassActor *cls)

{
  int o;
  bool bVar1;
  FxExpression *l;
  FxExpression *r;
  FxExpression *this;
  
  l = ParseExpressionF(sc,cls);
  while( true ) {
    bVar1 = FScanner::GetToken(sc);
    if ((!bVar1) || (o = sc->TokenType, 1 < o - 0x11fU)) break;
    r = ParseExpressionF(sc,cls);
    this = (FxExpression *)operator_new(0x48);
    FxCompareEq::FxCompareEq((FxCompareEq *)this,o,l,r);
    l = this;
  }
  if (sc->End == false) {
    FScanner::UnGet(sc);
  }
  return l;
}

Assistant:

static FxExpression *ParseExpressionG (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionF (sc, cls);

	while (sc.GetToken() && (sc.TokenType == TK_Eq || sc.TokenType == TK_Neq))
	{
		int token = sc.TokenType;
		FxExpression *right = ParseExpressionF (sc, cls);
		tmp = new FxCompareEq(token, tmp, right);
	}
	if (!sc.End) sc.UnGet();
	return tmp;
}